

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_UInt32 * tt_cmap14_get_nondef_chars(TT_CMap cmap,FT_Byte *p,FT_Memory memory)

{
  FT_Error FVar1;
  FT_CMap_Class pFVar2;
  ulong uVar3;
  byte *pbVar4;
  uint uVar5;
  
  uVar5 = *(uint *)p;
  uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  FVar1 = tt_cmap14_ensure((TT_CMap14)cmap,uVar5 + 1,memory);
  if (FVar1 == 0) {
    pbVar4 = p + 4;
    pFVar2 = cmap[1].cmap.clazz;
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      *(uint *)((long)&pFVar2->size + uVar3 * 4) =
           (uint)pbVar4[2] | (uint)pbVar4[1] << 8 | (uint)*pbVar4 << 0x10;
      pbVar4 = pbVar4 + 5;
    }
    *(FT_UInt32 *)((long)&pFVar2->size + (ulong)uVar5 * 4) = 0;
  }
  else {
    pFVar2 = (FT_CMap_Class)0x0;
  }
  return (FT_UInt32 *)pFVar2;
}

Assistant:

static FT_UInt32*
  tt_cmap14_get_nondef_chars( TT_CMap     cmap,
                              FT_Byte    *p,
                              FT_Memory   memory )
  {
    TT_CMap14   cmap14 = (TT_CMap14) cmap;
    FT_UInt32   numMappings;
    FT_UInt     i;
    FT_UInt32  *ret;


    numMappings = (FT_UInt32)TT_NEXT_ULONG( p );

    if ( tt_cmap14_ensure( cmap14, ( numMappings + 1 ), memory ) )
      return NULL;

    ret = cmap14->results;
    for ( i = 0; i < numMappings; i++ )
    {
      ret[i] = (FT_UInt32)TT_NEXT_UINT24( p );
      p += 2;
    }
    ret[i] = 0;

    return ret;
  }